

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

void luaG_ordererror(lua_State *L,TValue *p1,TValue *p2)

{
  if (luaT_typenames_[(ulong)(p1->tt_ & 0xf) + 1] == luaT_typenames_[(ulong)(p2->tt_ & 0xf) + 1]) {
    luaG_runerror(L,"attempt to compare two %s values");
  }
  luaG_runerror(L,"attempt to compare %s with %s");
}

Assistant:

l_noret luaG_ordererror (lua_State *L, const TValue *p1, const TValue *p2) {
  const char *t1 = objtypename(p1);
  const char *t2 = objtypename(p2);
  if (t1 == t2)
    luaG_runerror(L, "attempt to compare two %s values", t1);
  else
    luaG_runerror(L, "attempt to compare %s with %s", t1, t2);
}